

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatVehicle.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::Encode
          (GED_BasicGroundCombatVehicle *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_short>(stream,this->m_ui16EntityID);
  KDataStream::Write<short>(stream,this->m_i16Offsets[0]);
  KDataStream::Write<short>(stream,this->m_i16Offsets[1]);
  KDataStream::Write<short>(stream,this->m_i16Offsets[2]);
  (*(this->m_EA).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_EA,stream);
  KDataStream::Write(stream,this->m_i8Ori[0]);
  KDataStream::Write(stream,this->m_i8Ori[1]);
  KDataStream::Write(stream,this->m_i8Ori[2]);
  KDataStream::Write(stream,this->m_i8Spd);
  KDataStream::Write(stream,this->m_i8TrrtAz);
  KDataStream::Write(stream,this->m_i8GnElv);
  KDataStream::Write(stream,this->m_i8TrrtSlwRt);
  KDataStream::Write(stream,this->m_i8GnElvRt);
  return;
}

Assistant:

void GED_BasicGroundCombatVehicle::Encode( KDataStream & stream ) const
{
    stream << m_ui16EntityID
           << m_i16Offsets[0]
           << m_i16Offsets[1]
           << m_i16Offsets[2]
           << KDIS_STREAM m_EA
           << m_i8Ori[0]
           << m_i8Ori[1]
           << m_i8Ori[2]
           << m_i8Spd
           << m_i8TrrtAz
           << m_i8GnElv
           << m_i8TrrtSlwRt
           << m_i8GnElvRt;
}